

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cpp
# Opt level: O2

Camera * newCamera(Json *conf)

{
  bool bVar1;
  const_reference pvVar2;
  ThinlensCamera *this;
  undefined8 *puVar3;
  
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"type");
  bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"pinhole");
  if (bVar1) {
    this = (ThinlensCamera *)operator_new(0x60);
    PinholeCamera::PinholeCamera((PinholeCamera *)this,conf);
  }
  else {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"thinlens");
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "unrecognized camera type";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    this = (ThinlensCamera *)operator_new(0x68);
    ThinlensCamera::ThinlensCamera(this,conf);
  }
  return &this->super_Camera;
}

Assistant:

Camera* newCamera(const Json& conf) {
	if (conf["type"] == "pinhole")
		return new PinholeCamera(conf);
	if (conf["type"] == "thinlens")
		return new ThinlensCamera(conf);
	throw "unrecognized camera type";
}